

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

size_t __thiscall UdpSocketImpl::Write(UdpSocketImpl *this,void *buf,size_t len,string *strTo)

{
  size_t __n;
  int iVar1;
  uchar *__s;
  unsigned_long __n2;
  __array tmp;
  _Head_base<0UL,_unsigned_char_*,_false> local_40;
  size_t local_38;
  size_t local_30;
  
  if ((this->super_BaseSocketImpl).m_bStop == false) {
    local_38 = 0;
    if ((((len != 0) && (buf != (void *)0x0)) && (local_38 = 0, this->m_bCloseReq == false)) &&
       (strTo->_M_string_length != 0)) {
      local_38 = len;
      if (((this->m_fnSslEncode).super__Function_base._M_manager == (_Manager_type)0x0) ||
         (local_40._M_head_impl = (uchar *)buf, local_30 = len,
         iVar1 = (*(this->m_fnSslEncode)._M_invoker)
                           ((_Any_data *)&this->m_fnSslEncode,&local_40._M_head_impl,&local_30,strTo
                           ), iVar1 == 0)) {
        __n = local_38;
        __s = (uchar *)operator_new__(local_38);
        memset(__s,0,__n);
        local_40._M_head_impl = __s;
        if (__n != 0) {
          memcpy(__s,buf,__n);
        }
        iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mxOutDeque);
        if (iVar1 != 0) {
          std::__throw_system_error(iVar1);
        }
        LOCK();
        (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
             (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i + local_38;
        UNLOCK();
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string_const&>
                  ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                    *)&this->m_quOutData,
                   (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_40,
                   &local_38,strTo);
        pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxOutDeque);
        if (local_40._M_head_impl != (uchar *)0x0) {
          operator_delete__(local_40._M_head_impl);
        }
        iVar1 = 1;
      }
      if (0 < iVar1) {
        TriggerWriteThread(this);
      }
    }
  }
  else {
    local_38 = 0;
  }
  return local_38;
}

Assistant:

size_t UdpSocketImpl::Write(const void* buf, size_t len, const string& strTo)
{
    if (m_bStop == true || m_bCloseReq == true || buf == nullptr || len == 0 || strTo.empty() == true)
        return 0;

    int iRet = 0;
    if (m_fnSslEncode == nullptr || (iRet = m_fnSslEncode(reinterpret_cast<const uint8_t*>(buf), len, strTo), iRet == 0))
    {
        auto tmp = make_unique<uint8_t[]>(len);
        copy_n(&static_cast<const uint8_t*>(buf)[0], len, &tmp[0]);
        m_mxOutDeque.lock();
        m_atOutBytes += len;
        m_quOutData.emplace_back(move(tmp), len, strTo);
        m_mxOutDeque.unlock();

        iRet = 1;   // Trigger WriteThread
    }

    if (iRet > 0)
        TriggerWriteThread();

    return len;
}